

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifyMEND.hpp
# Opt level: O2

void njoy::ENDFtk::Material::verifyMEND(StructureDivision *structureDivision,long lineNumber)

{
  bool bVar1;
  undefined8 *puVar2;
  char *unaff_RBX;
  
  bVar1 = StructureDivision::isMend(structureDivision);
  if (bVar1) {
    return;
  }
  tools::Log::error<char_const*>(unaff_RBX);
  tools::Log::info<char_const*,long>("Line number: {}",lineNumber);
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = getenv;
  __cxa_throw(puVar2,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

static void
verifyMEND( const StructureDivision& structureDivision,
           long lineNumber ) {

  if ( not structureDivision.isMend() ) {

    Log::error( "Expected MEND record" );
    Log::info("Line number: {}", lineNumber );
    throw std::exception{};
  }
}